

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O1

void Tim_ManPrintStats(Tim_Man_t *p,int nAnd2Delay)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  uint uVar7;
  uint uVar8;
  void *__s;
  void *__s_00;
  long lVar9;
  undefined4 in_register_00000034;
  ulong uVar10;
  
  if (p != (Tim_Man_t *)0x0) {
    Abc_Print((int)p,(char *)CONCAT44(in_register_00000034,nAnd2Delay));
    if ((p->vBoxes == (Vec_Ptr_t *)0x0) || (p->vBoxes->nSize == 0)) {
      uVar7 = p->nCis;
    }
    else {
      uVar7 = Tim_ManBoxOutputFirst(p,0);
    }
    uVar2 = p->nCis;
    uVar8 = Tim_ManPoNum(p);
    if (p->vBoxes == (Vec_Ptr_t *)0x0) {
      uVar10 = 0;
    }
    else {
      uVar10 = (ulong)(uint)p->vBoxes->nSize;
    }
    printf("PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ",(ulong)uVar7,(ulong)uVar2,(ulong)uVar8,
           (ulong)(uint)p->nCos,uVar10);
    if (nAnd2Delay != 0) {
      printf("delay(AND2) = %d");
    }
    putchar(10);
    pVVar4 = p->vBoxes;
    if ((pVVar4 != (Vec_Ptr_t *)0x0) && (pVVar4->nSize != 0)) {
      if ((long)pVVar4->nSize < 1) {
        uVar7 = 0;
      }
      else {
        lVar9 = 0;
        uVar7 = 0;
        do {
          uVar2 = *(uint *)((long)pVVar4->pArray[lVar9] + 0x10);
          if ((int)uVar7 <= (int)uVar2) {
            uVar7 = uVar2;
          }
          lVar9 = lVar9 + 1;
        } while (pVVar4->nSize != lVar9);
      }
      uVar2 = uVar7 + 1;
      uVar10 = 0x10;
      if (0xe < uVar7) {
        uVar10 = (ulong)uVar2;
      }
      __s = malloc(uVar10 << 2);
      if (__s != (void *)0x0) {
        memset(__s,0,(ulong)uVar2 * 4);
      }
      uVar10 = 8;
      if (6 < uVar7) {
        uVar10 = (ulong)uVar2;
      }
      __s_00 = malloc(uVar10 << 3);
      memset(__s_00,0,(ulong)uVar2 << 3);
      pVVar4 = p->vBoxes;
      if (0 < pVVar4->nSize) {
        ppvVar5 = pVVar4->pArray;
        lVar9 = 0;
        do {
          pvVar6 = ppvVar5[lVar9];
          iVar3 = *(int *)((long)pvVar6 + 0x10);
          if (((long)iVar3 < 0) || ((int)uVar7 < iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          piVar1 = (int *)((long)__s + (long)iVar3 * 4);
          *piVar1 = *piVar1 + 1;
          iVar3 = *(int *)((long)pvVar6 + 0x10);
          if (((long)iVar3 < 0) || ((int)uVar7 < iVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          *(void **)((long)__s_00 + (long)iVar3 * 8) = pvVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar4->nSize);
      }
      uVar10 = 0;
      do {
        uVar7 = *(uint *)((long)__s + uVar10 * 4);
        if (uVar7 != 0) {
          lVar9 = *(long *)((long)__s_00 + uVar10 * 8);
          printf("    Box %4d      ",uVar10 & 0xffffffff);
          printf("Num = %4d   ",(ulong)uVar7);
          printf("Ins = %4d   ",(ulong)*(uint *)(lVar9 + 8));
          printf("Outs = %4d",(ulong)*(uint *)(lVar9 + 0xc));
          putchar(10);
        }
        uVar10 = uVar10 + 1;
      } while (uVar2 != uVar10);
      if (__s != (void *)0x0) {
        free(__s);
      }
      if (__s_00 != (void *)0x0) {
        free(__s_00);
        return;
      }
    }
  }
  return;
}

Assistant:

void Tim_ManPrintStats( Tim_Man_t * p, int nAnd2Delay )
{
    Tim_Box_t * pBox;
    Vec_Int_t * vCounts;
    Vec_Ptr_t * vBoxes;
    int i, Count, IdMax;
    if ( p == NULL )
        return;
    Abc_Print( 1, "Hierarchy      :  " );
    printf( "PI/CI = %d/%d   PO/CO = %d/%d   Box = %d   ", 
        Tim_ManPiNum(p), Tim_ManCiNum(p), 
        Tim_ManPoNum(p), Tim_ManCoNum(p), 
        Tim_ManBoxNum(p) );
    if ( nAnd2Delay )
        printf( "delay(AND2) = %d", nAnd2Delay );
    printf( "\n" );
    if ( Tim_ManBoxNum(p) == 0 )
        return;
    IdMax = 0;
    Tim_ManForEachBox( p, pBox, i )
        IdMax = Abc_MaxInt( IdMax, pBox->iDelayTable );
    vCounts = Vec_IntStart( IdMax+1 );
    vBoxes  = Vec_PtrStart( IdMax+1 );
    Tim_ManForEachBox( p, pBox, i )
    {
        Vec_IntAddToEntry( vCounts, pBox->iDelayTable, 1 );
        Vec_PtrWriteEntry( vBoxes, pBox->iDelayTable, pBox );
    }
    // print statistics about boxes
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 ) continue;
        pBox = (Tim_Box_t *)Vec_PtrEntry( vBoxes, i );
        printf( "    Box %4d      ", i );
        printf( "Num = %4d   ", Count );
        printf( "Ins = %4d   ", pBox->nInputs );
        printf( "Outs = %4d",   pBox->nOutputs );
        printf( "\n" );
    }
    Vec_IntFree( vCounts );
    Vec_PtrFree( vBoxes );
}